

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-stdio-over-pipes.c
# Opt level: O0

void test_stdio_over_pipes(int overlapped)

{
  uv_os_fd_t uVar1;
  int iVar2;
  uint uVar3;
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uv_stdio_container_t stdio [3];
  undefined1 local_80 [8];
  uv_process_t process;
  int r;
  int overlapped_local;
  
  process._100_4_ = overlapped;
  loop = uv_default_loop();
  init_process_options("stdio_over_pipes_helper",exit_cb);
  uv_pipe_init(loop,&out,0);
  uv_pipe_init(loop,&in,0);
  options.stdio = (uv_stdio_container_t *)&eval_a;
  uVar3 = 0;
  if (process._100_4_ != 0) {
    uVar3 = 0x40;
  }
  eval_a._0_4_ = uVar3 | 0x11;
  stdio[0]._0_8_ = &in;
  uVar3 = 0;
  if (process._100_4_ != 0) {
    uVar3 = 0x40;
  }
  stdio[0].data._0_4_ = uVar3 | 0x21;
  stdio[1]._0_8_ = &out;
  stdio[1].data.file = 2;
  uVar1 = uv_get_osfhandle(2);
  options.stdio[2].data.file = uVar1;
  options.stdio_count = 3;
  process.status = uv_spawn(loop,(uv_process_t *)local_80,&options);
  if ((long)process.status != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-stdio-over-pipes.c"
            ,0x8f,"r","==","0",(long)process.status,"==",0);
    abort();
  }
  process.status = uv_read_start((uv_stream_t *)&out,on_alloc,on_read);
  if ((long)process.status != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-stdio-over-pipes.c"
            ,0x92,"r","==","0",(long)process.status,"==",0);
    abort();
  }
  process.status = uv_run(loop,UV_RUN_DEFAULT);
  if ((long)process.status != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-stdio-over-pipes.c"
            ,0x95,"r","==","0",(long)process.status,"==",0);
    abort();
  }
  if ((long)on_read_cb_called < 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-stdio-over-pipes.c"
            ,0x97,"on_read_cb_called",">","1",(long)on_read_cb_called,">",1);
    abort();
  }
  if ((long)after_write_cb_called != 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-stdio-over-pipes.c"
            ,0x98,"2","==","after_write_cb_called",2,"==",(long)after_write_cb_called);
    abort();
  }
  if ((long)exit_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-stdio-over-pipes.c"
            ,0x99,"1","==","exit_cb_called",1,"==",(long)exit_cb_called);
    abort();
  }
  if ((long)close_cb_called != 3) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-stdio-over-pipes.c"
            ,0x9a,"3","==","close_cb_called",3,"==",(long)close_cb_called);
    abort();
  }
  iVar2 = memcmp("hello world\nhello world\n",output,0x18);
  if ((long)iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-stdio-over-pipes.c"
            ,0x9b,"memcmp(\"hello world\\nhello world\\n\", output, 24)","==","0",(long)iVar2,"==",0
           );
    abort();
  }
  if ((long)output_used != 0x18) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-stdio-over-pipes.c"
            ,0x9c,"24","==","output_used",0x18,"==",(long)output_used);
    abort();
  }
  close_loop(loop);
  iVar2 = uv_loop_close(loop);
  if ((long)iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-stdio-over-pipes.c"
            ,0x9e,"0","==","uv_loop_close(loop)",0,"==",(long)iVar2);
    abort();
  }
  uv_library_shutdown();
  return;
}

Assistant:

static void test_stdio_over_pipes(int overlapped) {
  int r;
  uv_process_t process;
  uv_stdio_container_t stdio[3];

  loop = uv_default_loop();

  init_process_options("stdio_over_pipes_helper", exit_cb);

  uv_pipe_init(loop, &out, 0);
  uv_pipe_init(loop, &in, 0);

  options.stdio = stdio;
  options.stdio[0].flags = UV_CREATE_PIPE | UV_READABLE_PIPE |
      (overlapped ?  UV_OVERLAPPED_PIPE : 0);
  options.stdio[0].data.stream = (uv_stream_t*) &in;
  options.stdio[1].flags = UV_CREATE_PIPE | UV_WRITABLE_PIPE |
      (overlapped ? UV_OVERLAPPED_PIPE : 0);
  options.stdio[1].data.stream = (uv_stream_t*) &out;
  options.stdio[2].flags = UV_INHERIT_FD;
  options.stdio[2].data.file = uv_get_osfhandle(2);
  options.stdio_count = 3;

  r = uv_spawn(loop, &process, &options);
  ASSERT_OK(r);

  r = uv_read_start((uv_stream_t*) &out, on_alloc, on_read);
  ASSERT_OK(r);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_GT(on_read_cb_called, 1);
  ASSERT_EQ(2, after_write_cb_called);
  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(3, close_cb_called);
  ASSERT_OK(memcmp("hello world\nhello world\n", output, 24));
  ASSERT_EQ(24, output_used);

  MAKE_VALGRIND_HAPPY(loop);
}